

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

region * __thiscall
toml::detail::syntax::non_ascii_key_char::scan(non_ascii_key_char *this,location *loc)

{
  bool bVar1;
  uint32_t uVar2;
  region *in_RDI;
  uint32_t cp;
  location first;
  undefined4 in_stack_ffffffffffffff68;
  region *this_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  location *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  region *in_stack_ffffffffffffffa0;
  non_ascii_key_char *in_stack_ffffffffffffffa8;
  
  this_00 = in_RDI;
  bVar1 = location::eof((location *)in_RDI);
  if (bVar1) {
    region::region(in_stack_ffffffffffffffa0);
  }
  else {
    location::location(in_stack_ffffffffffffff90,
                       (location *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    uVar2 = read_utf8(in_stack_ffffffffffffffa8,(location *)in_stack_ffffffffffffffa0);
    if (uVar2 == 0xffffffff) {
      region::region(in_stack_ffffffffffffffa0);
    }
    else if (((((((uVar2 == 0xb2) || (uVar2 == 0xb3)) || (uVar2 == 0xb9)) ||
               ((0xbb < uVar2 && (uVar2 < 0xbf)))) ||
              (((((0xbf < uVar2 && (uVar2 < 0xd7)) || ((0xd7 < uVar2 && (uVar2 < 0xf7)))) ||
                ((0xf7 < uVar2 && (uVar2 < 0x37e)))) ||
               ((((0x37e < uVar2 && (uVar2 < 0x2000)) || ((0x200b < uVar2 && (uVar2 < 0x200e)))) ||
                ((0x203e < uVar2 && (uVar2 < 0x2041)))))))) ||
             ((0x206f < uVar2 && (uVar2 < 0x2190)))) ||
            ((((0x245f < uVar2 && (uVar2 < 0x2500)) || ((0x2bff < uVar2 && (uVar2 < 0x2ff0)))) ||
             ((((0x3000 < uVar2 && (uVar2 < 0xd800)) || ((0xf8ff < uVar2 && (uVar2 < 0xfdd0)))) ||
              (((0xfdef < uVar2 && (uVar2 < 0xfffe)) || ((0xffff < uVar2 && (uVar2 < 0xf0000))))))))
            )) {
      region::region(in_stack_ffffffffffffffa0,(location *)CONCAT44(uVar2,in_stack_ffffffffffffff98)
                     ,in_stack_ffffffffffffff90);
    }
    else {
      location::operator=((location *)this_00,(location *)CONCAT44(uVar2,in_stack_ffffffffffffff68))
      ;
      region::region(in_stack_ffffffffffffffa0);
    }
    location::~location((location *)this_00);
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE region non_ascii_key_char::scan(location& loc) const
{
    if(loc.eof()) {return region{};}

    const auto first = loc;

    const auto cp = read_utf8(loc);

    if(cp == 0xFFFFFFFF)
    {
        return region{};
    }

    // ALPHA / DIGIT / %x2D / %x5F    ; a-z A-Z 0-9 - _
    // / %xB2 / %xB3 / %xB9 / %xBC-BE ; superscript digits, fractions
    // / %xC0-D6 / %xD8-F6 / %xF8-37D ; non-symbol chars in Latin block
    // / %x37F-1FFF                   ; exclude GREEK QUESTION MARK, which is basically a semi-colon
    // / %x200C-200D / %x203F-2040    ; from General Punctuation Block, include the two tie symbols and ZWNJ, ZWJ
    // / %x2070-218F / %x2460-24FF    ; include super-/subscripts, letterlike/numberlike forms, enclosed alphanumerics
    // / %x2C00-2FEF / %x3001-D7FF    ; skip arrows, math, box drawing etc, skip 2FF0-3000 ideographic up/down markers and spaces
    // / %xF900-FDCF / %xFDF0-FFFD    ; skip D800-DFFF surrogate block, E000-F8FF Private Use area, FDD0-FDEF intended for process-internal use (unicode)
    // / %x10000-EFFFF                ; all chars outside BMP range, excluding Private Use planes (F0000-10FFFF)

    if(cp == 0xB2 || cp == 0xB3 || cp == 0xB9 || (0xBC <= cp && cp <= 0xBE) ||
       (0xC0    <= cp && cp <= 0xD6  ) || (0xD8 <= cp && cp <= 0xF6) || (0xF8 <= cp && cp <= 0x37D) ||
       (0x37F   <= cp && cp <= 0x1FFF) ||
       (0x200C  <= cp && cp <= 0x200D) || (0x203F <= cp && cp <= 0x2040) ||
       (0x2070  <= cp && cp <= 0x218F) || (0x2460 <= cp && cp <= 0x24FF) ||
       (0x2C00  <= cp && cp <= 0x2FEF) || (0x3001 <= cp && cp <= 0xD7FF) ||
       (0xF900  <= cp && cp <= 0xFDCF) || (0xFDF0 <= cp && cp <= 0xFFFD) ||
       (0x10000 <= cp && cp <= 0xEFFFF) )
    {
        return region(first, loc);
    }
    loc = first;
    return region{};
}